

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O1

int mock_loader_impl_initialize_types(loader_impl impl)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  
  lVar4 = 8;
  do {
    lVar2 = type_create(*(undefined4 *)((long)&__do_global_dtors_aux_fini_array_entry + lVar4),
                        *(undefined8 *)
                         ((long)&mock_loader_impl_initialize_types::type_id_name_pair[0].id + lVar4)
                        ,0,0);
    if (lVar2 != 0) {
      uVar3 = type_name(lVar2);
      iVar1 = loader_impl_type_define(impl,uVar3,lVar2);
      if (iVar1 != 0) {
        type_destroy(lVar2);
        return 1;
      }
    }
    lVar4 = lVar4 + 0x10;
  } while (lVar4 != 0xa8);
  return 0;
}

Assistant:

int mock_loader_impl_initialize_types(loader_impl impl)
{
	/* TODO: move this to loader_impl by passing the structure and loader_impl_derived callback */

	static struct
	{
		type_id id;
		const char *name;
	} type_id_name_pair[] = {
		{ TYPE_BOOL, "Boolean" },
		{ TYPE_CHAR, "Char" },
		{ TYPE_SHORT, "Short" },
		{ TYPE_INT, "Integer" },
		{ TYPE_LONG, "Long" },
		{ TYPE_FLOAT, "Float" },
		{ TYPE_DOUBLE, "Double" },
		{ TYPE_STRING, "String" },
		{ TYPE_BUFFER, "Buffer" },
		{ TYPE_PTR, "Ptr" }
	};

	size_t index, size = sizeof(type_id_name_pair) / sizeof(type_id_name_pair[0]);

	for (index = 0; index < size; ++index)
	{
		type t = type_create(type_id_name_pair[index].id, type_id_name_pair[index].name, NULL, NULL);

		if (t != NULL)
		{
			if (loader_impl_type_define(impl, type_name(t), t) != 0)
			{
				type_destroy(t);
				return 1;
			}
		}
	}

	return 0;
}